

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O2

void __thiscall SuiteSessionIDTests::TeststreamOut::TeststreamOut(TeststreamOut *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"streamOut","SessionIDTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x65);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ed50;
  return;
}

Assistant:

TEST(streamOut)
{
  SessionID object( BeginString( "FIX.4.2" ),
                    SenderCompID( "SENDER" ),
                    TargetCompID( "TARGET" ) );

  std::stringstream strstream;
  strstream << object;
  CHECK_EQUAL( "FIX.4.2:SENDER->TARGET", strstream.str() );
}